

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O3

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  BYTE wksp [512];
  ulong local_2b8;
  short local_2a8 [56];
  undefined1 local_238 [520];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < mostFrequent || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  if (strategy < ZSTD_lazy) {
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if (1 < defaultNormLog - 5) {
        __assert_fail("defaultNormLog >= 5 && defaultNormLog <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0xb9,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if (strategy == 0) {
        __assert_fail("mult <= 9 && mult >= 7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0xba,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if ((nbSeq < 1000) && (*repeatMode == FSE_repeat_valid)) {
        return set_repeat;
      }
      if ((nbSeq < ((ulong)(10 - strategy) << ((byte)defaultNormLog & 0x3f)) >> 3) ||
         (mostFrequent < nbSeq >> ((byte)defaultNormLog - 1 & 0x3f))) goto LAB_001c11c1;
    }
  }
  else {
    local_2b8 = 0xffffffffffffffff;
    uVar2 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      uVar2 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,count,max);
    }
    if (*repeatMode != FSE_repeat_none) {
      local_2b8 = ZSTD_fseBitCost(prevCTable,count,max);
    }
    uVar1 = FSE_optimalTableLog(FSELog,nbSeq,max);
    sVar3 = FSE_normalizeCount(local_2a8,uVar1,count,nbSeq,max,(uint)(0x7ff < nbSeq));
    if (sVar3 < 0xffffffffffffff89) {
      sVar3 = FSE_writeNCount(local_238,0x200,local_2a8,max,uVar1);
    }
    if (nbSeq == 0) {
      __assert_fail("total > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0x59,
                    "size_t ZSTD_entropyCost(const unsigned int *, const unsigned int, const size_t)"
                   );
    }
    uVar6 = 0;
    uVar1 = 0;
    do {
      uVar7 = count[uVar6];
      if (nbSeq <= uVar7) {
        __assert_fail("count[s] < total",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0x5e,
                      "size_t ZSTD_entropyCost(const unsigned int *, const unsigned int, const size_t)"
                     );
      }
      uVar4 = (uVar7 << 8) / nbSeq;
      uVar5 = uVar4;
      if (uVar7 << 8 < nbSeq) {
        uVar5 = 1;
      }
      if (uVar7 == 0) {
        uVar5 = uVar4;
      }
      uVar1 = uVar1 + uVar7 * kInverseProbabilityLog256[uVar5];
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
    } while (uVar7 <= max);
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if (0xffffffffffffff88 < uVar2) {
        __assert_fail("!ZSTD_isError(basicCost)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0xd4,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if (0xffffffffffffff88 < local_2b8 && *repeatMode == FSE_repeat_valid) {
        __assert_fail("!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0xd5,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
    }
    if (0xffffffffffffff88 < sVar3) {
      __assert_fail("!ZSTD_isError(NCountCost)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0xd7,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    uVar6 = sVar3 * 8 + (ulong)(uVar1 >> 8);
    if (0xffffffffffffff87 < uVar6) {
      __assert_fail("compressedCost < ERROR(maxCode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0xd8,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((uVar2 <= local_2b8) && (uVar2 <= uVar6)) {
      if (isDefaultAllowed == ZSTD_defaultDisallowed) {
        __assert_fail("isDefaultAllowed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                      ,0xdd,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
LAB_001c11c1:
      *repeatMode = FSE_repeat_none;
      return set_basic;
    }
    if (local_2b8 <= uVar6) {
      return set_repeat;
    }
    if (uVar2 <= uVar6) {
      __assert_fail("compressedCost < basicCost && compressedCost < repeatCost",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0xe6,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
  }
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or fewer symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}